

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++:278:22)>
::getImpl(SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:278:22)>
          *this,ExceptionOrValue *output)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 aVar1;
  undefined8 uVar2;
  ExceptionOr<kj::_::Void> depResult;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 local_378;
  ExceptionOr<kj::Promise<void>_> local_370;
  ExceptionOrValue local_1c8;
  char local_30;
  
  local_1c8.exception.ptr.isSet = false;
  local_30 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_1c8);
  uVar2 = local_1c8.exception.ptr.field_1.value.context.ptr.ptr;
  if (local_1c8.exception.ptr.isSet == true) {
    local_370.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         local_1c8.exception.ptr.field_1.value.ownFile.content.ptr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         local_1c8.exception.ptr.field_1.value.ownFile.content.size_;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_1c8.exception.ptr.field_1.value.ownFile.content.disposer;
    local_1c8.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_1c8.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_1c8.exception.ptr.field_1.value.file;
    local_370.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_1c8.exception.ptr.field_1._32_8_;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         local_1c8.exception.ptr.field_1.value.description.content.ptr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_1c8.exception.ptr.field_1.value.description.content.size_;
    local_1c8.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_1c8.exception.ptr.field_1.value.description.content.size_ = 0;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_1c8.exception.ptr.field_1.value.description.content.disposer;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_1c8.exception.ptr.field_1.value.context.ptr.disposer;
    local_1c8.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr = (Context *)uVar2;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         local_1c8.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         local_1c8.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         local_1c8.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_1c8.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_1c8.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_370.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&local_1c8.exception.ptr.field_1 + 0x68),0x105);
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         local_1c8.exception.ptr.field_1.value.details.builder.ptr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         local_1c8.exception.ptr.field_1.value.details.builder.pos;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         local_1c8.exception.ptr.field_1.value.details.builder.endPtr;
    local_370.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         local_1c8.exception.ptr.field_1.value.details.builder.disposer;
    local_1c8.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_1c8.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_1c8.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    local_370.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_370)
    ;
    aVar1 = local_370.value.ptr.field_1;
    if ((local_370.value.ptr.isSet == true) &&
       (local_370.value.ptr.field_1 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0)) {
      local_370.value.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar1);
    }
  }
  else {
    if (local_30 != '\x01') goto LAB_0017f5f9;
    kj::anon_unknown_0::makeChain((anon_unknown_0 *)&local_378.value,(this->func).i - 1);
    local_370.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_370.value.ptr.isSet = true;
    local_370.value.ptr.field_1 = local_378;
    local_378 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
    ExceptionOr<kj::Promise<void>_>::operator=((ExceptionOr<kj::Promise<void>_> *)output,&local_370)
    ;
    aVar1 = local_370.value.ptr.field_1;
    if ((local_370.value.ptr.isSet == true) &&
       (local_370.value.ptr.field_1 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0)) {
      local_370.value.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar1);
    }
  }
  if (local_370.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_370.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_0017f5f9:
  if (local_1c8.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1c8.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }